

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsStyle.cxx
# Opt level: O0

void AddFeature(char *name,char *value,bool enable)

{
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  kwsFeature f;
  kwsFeature *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  vector<kwsFeature,_std::allocator<kwsFeature>_> *in_stack_ffffffffffffff80;
  string local_60 [32];
  string local_40 [32];
  byte local_20;
  byte local_11;
  char *local_10;
  char *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  kwsFeature::kwsFeature(in_stack_ffffffffffffff70);
  std::__cxx11::string::operator=((string *)&stack0xffffffffffffff80,local_8);
  std::__cxx11::string::operator=(local_60,local_10);
  local_20 = local_11 & 1;
  std::__cxx11::string::operator=(local_40,"");
  std::vector<kwsFeature,_std::allocator<kwsFeature>_>::push_back
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  kwsFeature::~kwsFeature(in_stack_ffffffffffffff70);
  return;
}

Assistant:

static void AddFeature(const char* name,const char* value,bool enable)
{
  kwsFeature f;
  f.name = name;
  f.value = value;
  f.enable = enable;
  f.filename = "";
  features.push_back(f);
}